

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::transfer_integ_error
               (Mesh *old_mesh,Mesh *new_mesh,CavsByBdryStatus *cavs,Reals *old_elem_densities,
               Reals *new_elem_densities,string *error_name,LOs same_ents2old_ents,
               LOs same_ents2new_ents,ConservedBools conserved_bools)

{
  pointer pCVar1;
  Int ent_dim;
  Int width;
  LO LVar2;
  int width_00;
  Int IVar3;
  Tag<double> *pTVar4;
  long lVar5;
  _func_int **pp_Var6;
  pointer pCVar7;
  Reals new_cav_elem_integrals;
  Read<double> old_cav_elem_densities;
  Write<double> local_578;
  Write<double> local_568;
  Read<double> new_cav_elem_sizes;
  Read<double> new_cav_elem_densities;
  Write<int> local_538;
  Reals new_elem_sizes;
  Write<double> new_elem_errors_w;
  Reals old_cav_elem_integrals;
  Write<int> local_4f0;
  Reals cav_error_densities_1;
  Read<double> old_cav_elem_sizes;
  Read<double> new_cav_sizes_1;
  Graph keys2new_elems;
  Graph keys2old_elems;
  Write<double> local_460;
  Write<int> local_450;
  Read<double> old_cav_errors;
  Write<double> local_430;
  Write<double> local_420;
  Read<double> old_cav_integrals;
  Write<double> local_400;
  Read<double> cav_elem_error_densities_1;
  Reals old_elem_sizes;
  Write<double> local_3b0;
  Write<double> local_3a0;
  Write<double> local_390;
  Write<double> local_380;
  Write<double> local_370;
  Write<double> local_360;
  Write<int> local_350;
  Write<double> local_340;
  Write<double> local_330;
  Write<int> local_320;
  Write<signed_char> local_310;
  Read<double> same_errors;
  Read<double> old_elem_errors;
  Write<int> local_2e0;
  Write<double> local_2d0;
  Write<double> local_2c0;
  Read<double> new_cav_sizes;
  Read<double> cav_errors;
  Write<double> local_290;
  Write<double> local_280;
  Write<double> local_270;
  Omega_h local_260 [16];
  Write<double> local_250;
  Omega_h local_240 [16];
  Reals new_elem_errors;
  Reals cav_elem_errors;
  Write<double> local_1e0;
  Read<double> cav_elem_error_densities;
  Write<double> local_1c0;
  Reals cav_error_densities;
  Write<int> local_1a0;
  Write<double> local_190;
  Write<int> local_180;
  Read<double> new_cav_integrals;
  Write<int> local_160;
  string local_150;
  Write<double> local_130;
  Omega_h local_120 [16];
  Write<int> local_110;
  Write<double> local_100;
  Write<double> local_f0;
  Write<double> local_e0;
  Write<double> local_d0;
  Write<double> local_c0;
  Cavs local_b0;
  Cavs local_70;
  
  begin_code("transfer_integ_error",(char *)0x0);
  ent_dim = Mesh::dim(old_mesh);
  pTVar4 = Mesh::get_tag<double>(old_mesh,ent_dim,error_name);
  width = TagBase::ncomps(&pTVar4->super_TagBase);
  Tag<double>::array((Tag<double> *)&old_elem_errors);
  LVar2 = Mesh::nelems(new_mesh);
  std::__cxx11::string::string((string *)&new_elem_errors,"",(allocator *)&keys2new_elems);
  Write<double>::Write(&new_elem_errors_w,LVar2 * width,0.0,(string *)&new_elem_errors);
  std::__cxx11::string::~string((string *)&new_elem_errors);
  Write<int>::Write(&local_320,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc);
  Write<double>::Write(&local_330,&old_elem_errors.write_);
  unmap<double>((Omega_h *)&local_310,(LOs *)&local_320,(Read<signed_char> *)&local_330,width);
  read<double>((Omega_h *)&same_errors,&local_310);
  Write<double>::~Write((Write<double> *)&local_310);
  Write<double>::~Write(&local_330);
  Write<int>::~Write(&local_320);
  Write<double>::Write(&local_340,&same_errors.write_);
  Write<int>::Write(&local_350,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
  Write<double>::Write(&local_360,&new_elem_errors_w);
  map_into<double>((Read<signed_char> *)&local_340,(LOs *)&local_350,
                   (Write<signed_char> *)&local_360,width);
  Write<double>::~Write(&local_360);
  Write<int>::~Write(&local_350);
  Write<double>::~Write(&local_340);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    if (conserved_bools.this_time._M_elems[lVar5 + -0x10] == false) {
      pCVar1 = cavs->_M_elems[lVar5]._M_elems[1].
               super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar7 = cavs->_M_elems[lVar5]._M_elems[1].
                    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1) {
        Cavs::Cavs((Cavs *)&new_elem_errors,pCVar7);
        Cavs::Cavs(&local_70,(Cavs *)&new_elem_errors);
        Write<double>::Write(&local_420,&old_elem_densities->write_);
        Write<double>::Write(&local_370,&new_elem_densities->write_);
        Write<double>::Write(&local_380,&new_elem_errors_w);
        if (((ulong)local_420.shared_alloc_.alloc & 1) == 0) {
          pp_Var6 = (_func_int **)(local_420.shared_alloc_.alloc)->size;
        }
        else {
          pp_Var6 = (_func_int **)((ulong)local_420.shared_alloc_.alloc >> 3);
        }
        LVar2 = Mesh::nelems(old_mesh);
        width_00 = divide_no_remainder<int>((int)((ulong)pp_Var6 >> 3),LVar2);
        Graph::Graph(&keys2new_elems,&local_70.keys2new_elems);
        Graph::Graph(&keys2old_elems,&local_70.keys2old_elems);
        Mesh::ask_sizes((Mesh *)&old_elem_sizes);
        Mesh::ask_sizes((Mesh *)&new_elem_sizes);
        Write<int>::Write(&local_538,&keys2old_elems.ab2b.write_);
        Write<double>::Write(&local_430,&local_420);
        unmap<double>(local_240,(LOs *)&local_538,(Read<signed_char> *)&local_430,width_00);
        read<double>((Omega_h *)&old_cav_elem_densities,(Write<signed_char> *)local_240);
        Write<double>::~Write((Write<double> *)local_240);
        Write<double>::~Write(&local_430);
        Write<int>::~Write(&local_538);
        Write<int>::Write(&local_450,&keys2new_elems.ab2b.write_);
        Write<double>::Write(&new_cav_sizes_1.write_,&local_370);
        unmap<double>((Omega_h *)&old_cav_errors,(LOs *)&local_450,
                      (Read<signed_char> *)&new_cav_sizes_1.write_,width_00);
        read<double>((Omega_h *)&new_cav_elem_densities,(Write<signed_char> *)&old_cav_errors);
        Write<double>::~Write((Write<double> *)&old_cav_errors);
        Write<double>::~Write(&new_cav_sizes_1.write_);
        Write<int>::~Write(&local_450);
        Write<int>::Write((Write<int> *)&cav_error_densities_1,&keys2old_elems.ab2b.write_);
        Write<double>::Write(&local_460,&old_elem_sizes.write_);
        unmap<double>((Omega_h *)&local_250,(LOs *)&cav_error_densities_1,
                      (Read<signed_char> *)&local_460,1);
        read<double>((Omega_h *)&old_cav_elem_sizes,(Write<signed_char> *)&local_250);
        Write<double>::~Write(&local_250);
        Write<double>::~Write(&local_460);
        Write<int>::~Write((Write<int> *)&cav_error_densities_1);
        Write<int>::Write(&local_4f0,&keys2new_elems.ab2b.write_);
        Write<double>::Write(&local_400,&new_elem_sizes.write_);
        unmap<double>((Omega_h *)&cav_elem_error_densities_1,(LOs *)&local_4f0,
                      (Read<signed_char> *)&local_400,1);
        read<double>((Omega_h *)&new_cav_elem_sizes,
                     (Write<signed_char> *)&cav_elem_error_densities_1);
        Write<double>::~Write((Write<double> *)&cav_elem_error_densities_1);
        Write<double>::~Write(&local_400);
        Write<int>::~Write(&local_4f0);
        Write<double>::Write(&local_568,&old_cav_elem_densities.write_);
        Write<double>::Write(&local_578,&old_cav_elem_sizes.write_);
        std::__cxx11::string::string((string *)&local_150,"",(allocator *)&new_cav_elem_integrals);
        multiply_each<double>
                  (local_260,(Read<double> *)&local_568,(Read<double> *)&local_578,&local_150);
        Read<double>::Read((Read<signed_char> *)&old_cav_elem_integrals,(Write<double> *)local_260);
        Write<double>::~Write((Write<double> *)local_260);
        std::__cxx11::string::~string((string *)&local_150);
        Write<double>::~Write(&local_578);
        Write<double>::~Write(&local_568);
        Write<double>::Write(&local_280,&new_cav_elem_densities.write_);
        Write<double>::Write(&local_290,&new_cav_elem_sizes.write_);
        std::__cxx11::string::string((string *)&local_150,"",(allocator *)&old_cav_integrals);
        multiply_each<double>
                  ((Omega_h *)&local_270,(Read<double> *)&local_280,(Read<double> *)&local_290,
                   &local_150);
        Read<double>::Read((Read<signed_char> *)&new_cav_elem_integrals,&local_270);
        Write<double>::~Write(&local_270);
        std::__cxx11::string::~string((string *)&local_150);
        Write<double>::~Write(&local_290);
        Write<double>::~Write(&local_280);
        Write<int>::Write(&local_160,(Write<int> *)&keys2old_elems);
        Write<double>::Write(&local_c0,&old_cav_elem_integrals.write_);
        fan_reduce<double>((Omega_h *)&old_cav_integrals,(LOs *)&local_160,
                           (Read<signed_char> *)&local_c0,width_00,OMEGA_H_SUM);
        Write<double>::~Write(&local_c0);
        Write<int>::~Write(&local_160);
        Write<int>::Write(&local_180,(Write<int> *)&keys2new_elems);
        Write<double>::Write(&local_d0,&new_cav_elem_integrals.write_);
        fan_reduce<double>((Omega_h *)&new_cav_integrals,(LOs *)&local_180,
                           (Read<signed_char> *)&local_d0,width_00,OMEGA_H_SUM);
        Write<double>::~Write(&local_d0);
        Write<int>::~Write(&local_180);
        Write<double>::Write(&local_190,(Write<double> *)&new_cav_integrals);
        Write<double>::Write(&local_e0,&old_cav_integrals.write_);
        subtract_each<double>
                  ((Omega_h *)&cav_errors,(Read<double> *)&local_190,(Read<double> *)&local_e0);
        Write<double>::~Write(&local_e0);
        Write<double>::~Write(&local_190);
        Write<int>::Write(&local_1a0,(Write<int> *)&keys2new_elems);
        Write<double>::Write(&local_f0,&new_cav_elem_sizes.write_);
        fan_reduce<double>((Omega_h *)&new_cav_sizes,(LOs *)&local_1a0,
                           (Read<signed_char> *)&local_f0,1,OMEGA_H_SUM);
        Write<double>::~Write(&local_f0);
        Write<int>::~Write(&local_1a0);
        Write<double>::Write(&local_1c0,&cav_errors.write_);
        Write<double>::Write(&local_100,&new_cav_sizes.write_);
        divide_each_maybe_zero
                  ((Omega_h *)&cav_error_densities,(Reals *)&local_1c0,(Reals *)&local_100);
        Write<double>::~Write(&local_100);
        Write<double>::~Write(&local_1c0);
        Write<double>::Write(&local_1e0,(Write<double> *)&cav_error_densities);
        Write<int>::Write(&local_110,(Write<int> *)&keys2new_elems);
        expand<double>((Omega_h *)&cav_elem_error_densities,(Read<signed_char> *)&local_1e0,
                       (LOs *)&local_110,width_00);
        Write<int>::~Write(&local_110);
        Write<double>::~Write(&local_1e0);
        Write<double>::Write(&local_2c0,(Write<double> *)&cav_elem_error_densities);
        Write<double>::Write(&local_2d0,&new_cav_elem_sizes.write_);
        std::__cxx11::string::string((string *)&local_150,"",(allocator *)&local_2e0);
        multiply_each<double>
                  (local_120,(Read<double> *)&local_2c0,(Read<double> *)&local_2d0,&local_150);
        Read<double>::Read((Read<signed_char> *)&cav_elem_errors.write_,(Write<double> *)local_120);
        Write<double>::~Write((Write<double> *)local_120);
        std::__cxx11::string::~string((string *)&local_150);
        Write<double>::~Write(&local_2d0);
        Write<double>::~Write(&local_2c0);
        Write<double>::Write((Write<double> *)&local_150,&cav_elem_errors.write_);
        Write<int>::Write(&local_2e0,&keys2new_elems.ab2b.write_);
        Write<double>::Write(&local_130,&local_380);
        add_into<double>((Read<signed_char> *)&local_150,(LOs *)&local_2e0,
                         (Write<signed_char> *)&local_130,width_00);
        Write<double>::~Write(&local_130);
        Write<int>::~Write(&local_2e0);
        Write<double>::~Write((Write<double> *)&local_150);
        Write<double>::~Write(&cav_elem_errors.write_);
        Write<double>::~Write(&cav_elem_error_densities.write_);
        Write<double>::~Write(&cav_error_densities.write_);
        Write<double>::~Write(&new_cav_sizes.write_);
        Write<double>::~Write(&cav_errors.write_);
        Write<double>::~Write(&new_cav_integrals.write_);
        Write<double>::~Write(&old_cav_integrals.write_);
        Write<double>::~Write(&new_cav_elem_integrals.write_);
        Write<double>::~Write(&old_cav_elem_integrals.write_);
        Write<double>::~Write(&new_cav_elem_sizes.write_);
        Write<double>::~Write(&old_cav_elem_sizes.write_);
        Write<double>::~Write(&new_cav_elem_densities.write_);
        Write<double>::~Write(&old_cav_elem_densities.write_);
        Write<double>::~Write(&new_elem_sizes.write_);
        Write<double>::~Write(&old_elem_sizes.write_);
        Graph::~Graph(&keys2old_elems);
        Graph::~Graph(&keys2new_elems);
        Write<double>::~Write(&local_380);
        Write<double>::~Write(&local_370);
        Write<double>::~Write(&local_420);
        Cavs::~Cavs(&local_70);
        Cavs::~Cavs((Cavs *)&new_elem_errors);
      }
    }
    if (conserved_bools.this_time._M_elems[lVar5 + -0xd] == false) {
      pCVar1 = cavs->_M_elems[lVar5]._M_elems[1].
               super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar7 = cavs->_M_elems[lVar5]._M_elems[1].
                    super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1) {
        Cavs::Cavs((Cavs *)&new_elem_errors,pCVar7);
        Cavs::Cavs(&local_b0,(Cavs *)&new_elem_errors);
        Write<double>::Write(&local_390,&new_elem_errors_w);
        IVar3 = Mesh::dim(old_mesh);
        Graph::Graph(&keys2new_elems,&local_b0.keys2old_elems);
        Graph::Graph(&keys2old_elems,&local_b0.keys2new_elems);
        Mesh::ask_sizes((Mesh *)&new_elem_sizes);
        Write<int>::Write(&local_538,&keys2old_elems.ab2b.write_);
        Write<double>::Write(&local_430,&new_elem_sizes.write_);
        unmap<double>(local_240,(LOs *)&local_538,(Read<signed_char> *)&local_430,1);
        read<double>((Omega_h *)&old_cav_elem_densities,(Write<signed_char> *)local_240);
        Write<double>::~Write((Write<double> *)local_240);
        Write<double>::~Write(&local_430);
        Write<int>::~Write(&local_538);
        pTVar4 = Mesh::get_tag<double>(old_mesh,IVar3,error_name);
        IVar3 = TagBase::ncomps(&pTVar4->super_TagBase);
        Tag<double>::array((Tag<double> *)&new_cav_elem_densities);
        Graph::Graph((Graph *)&local_150,&keys2new_elems);
        Write<double>::Write((Write<double> *)&local_450,&new_cav_elem_densities.write_);
        graph_reduce<double>
                  ((Omega_h *)&old_cav_errors,(Graph *)&local_150,(Read<double> *)&local_450,IVar3,
                   OMEGA_H_SUM);
        Write<double>::~Write((Write<double> *)&local_450);
        Graph::~Graph((Graph *)&local_150);
        Write<int>::Write((Write<int> *)&old_cav_elem_sizes,(Write<int> *)&keys2old_elems);
        Write<double>::Write(&local_250,&old_cav_elem_densities.write_);
        fan_reduce<double>((Omega_h *)&new_cav_sizes_1,(LOs *)&old_cav_elem_sizes,
                           (Read<signed_char> *)&local_250,1,OMEGA_H_SUM);
        Write<double>::~Write(&local_250);
        Write<int>::~Write((Write<int> *)&old_cav_elem_sizes);
        Write<double>::Write(&local_460,&old_cav_errors.write_);
        Write<double>::Write(&new_cav_elem_sizes.write_,&new_cav_sizes_1.write_);
        divide_each_maybe_zero
                  ((Omega_h *)&cav_error_densities_1,(Reals *)&local_460,
                   (Reals *)&new_cav_elem_sizes.write_);
        Write<double>::~Write(&new_cav_elem_sizes.write_);
        Write<double>::~Write(&local_460);
        Write<double>::Write((Write<double> *)&local_4f0,(Write<double> *)&cav_error_densities_1);
        Write<int>::Write((Write<int> *)&local_400,(Write<int> *)&keys2old_elems);
        expand<double>((Omega_h *)&cav_elem_error_densities_1,(Read<signed_char> *)&local_4f0,
                       (LOs *)&local_400,IVar3);
        Write<int>::~Write((Write<int> *)&local_400);
        Write<double>::~Write((Write<double> *)&local_4f0);
        Write<double>::Write(&local_568,(Write<double> *)&cav_elem_error_densities_1);
        Write<double>::Write(&local_578,&old_cav_elem_densities.write_);
        std::__cxx11::string::string
                  ((string *)&old_elem_sizes,"",(allocator *)&new_cav_elem_integrals);
        multiply_each<double>
                  (local_260,(Read<double> *)&local_568,(Read<double> *)&local_578,
                   (string *)&old_elem_sizes);
        Read<double>::Read((Read<signed_char> *)&old_cav_elem_integrals.write_,
                           (Write<double> *)local_260);
        Write<double>::~Write((Write<double> *)local_260);
        std::__cxx11::string::~string((string *)&old_elem_sizes);
        Write<double>::~Write(&local_578);
        Write<double>::~Write(&local_568);
        Write<double>::Write((Write<double> *)&old_elem_sizes,&old_cav_elem_integrals.write_);
        Write<int>::Write((Write<int> *)&new_cav_elem_integrals,&keys2old_elems.ab2b.write_);
        Write<double>::Write(&local_270,&local_390);
        add_into<double>((Read<signed_char> *)&old_elem_sizes.write_,(LOs *)&new_cav_elem_integrals,
                         (Write<signed_char> *)&local_270,IVar3);
        Write<double>::~Write(&local_270);
        Write<int>::~Write((Write<int> *)&new_cav_elem_integrals);
        Write<double>::~Write(&old_elem_sizes.write_);
        Write<double>::~Write(&old_cav_elem_integrals.write_);
        Write<double>::~Write(&cav_elem_error_densities_1.write_);
        Write<double>::~Write(&cav_error_densities_1.write_);
        Write<double>::~Write(&new_cav_sizes_1.write_);
        Write<double>::~Write(&old_cav_errors.write_);
        Write<double>::~Write(&new_cav_elem_densities.write_);
        Write<double>::~Write(&old_cav_elem_densities.write_);
        Write<double>::~Write(&new_elem_sizes.write_);
        Graph::~Graph(&keys2old_elems);
        Graph::~Graph(&keys2new_elems);
        Write<double>::~Write(&local_390);
        Cavs::~Cavs(&local_b0);
        Cavs::~Cavs((Cavs *)&new_elem_errors);
      }
    }
  }
  Write<double>::Write(&local_3a0,&new_elem_errors_w);
  Read<double>::Read((Read<signed_char> *)&new_elem_errors,&local_3a0);
  Write<double>::~Write(&local_3a0);
  Write<double>::Write(&local_3b0,&new_elem_errors.write_);
  Mesh::add_tag<double>(new_mesh,ent_dim,error_name,width,(Read<double> *)&local_3b0,false);
  Write<double>::~Write(&local_3b0);
  end_code();
  Write<double>::~Write(&new_elem_errors.write_);
  Write<double>::~Write(&same_errors.write_);
  Write<double>::~Write(&new_elem_errors_w);
  Write<double>::~Write(&old_elem_errors.write_);
  return;
}

Assistant:

static void transfer_integ_error(Mesh* old_mesh, Mesh* new_mesh,
    CavsByBdryStatus const& cavs, Reals old_elem_densities,
    Reals new_elem_densities, std::string const& error_name,
    LOs same_ents2old_ents, LOs same_ents2new_ents,
    ConservedBools conserved_bools) {
  begin_code("transfer_integ_error");
  auto dim = old_mesh->dim();
  auto old_tag = old_mesh->get_tag<Real>(dim, error_name);
  auto ncomps = old_tag->ncomps();
  auto old_elem_errors = old_tag->array();
  auto new_elem_errors_w = Write<Real>(new_mesh->nelems() * ncomps, 0.0);
  auto same_errors = read(unmap(same_ents2old_ents, old_elem_errors, ncomps));
  map_into(same_errors, same_ents2new_ents, new_elem_errors_w, ncomps);
  for (std::size_t i = 0; i < 3; ++i) {
    if (!conserved_bools.this_time[i]) {
      for (auto class_cavs : cavs[i][CLASS_COLOR]) {
        introduce_class_integ_error(old_mesh, new_mesh, class_cavs,
            old_elem_densities, new_elem_densities, new_elem_errors_w);
      }
    }
    if (!conserved_bools.always[i]) {
      for (auto bdry_cavs : cavs[i][CLASS_COLOR]) {
        carry_class_bdry_integ_error(
            old_mesh, new_mesh, bdry_cavs, error_name, new_elem_errors_w);
      }
    }
  }
  auto new_elem_errors = Reals(new_elem_errors_w);
  new_mesh->add_tag(dim, error_name, ncomps, new_elem_errors);
  end_code();
}